

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_bitonic_sort(int **dst,size_t size)

{
  int **in_RSI;
  int **in_RDI;
  int **in_stack_00000028;
  int **in_stack_00000048;
  int **in_stack_00000078;
  int **in_stack_00000098;
  int **in_stack_000000c8;
  int **in_stack_000000f8;
  int **in_stack_00000120;
  int **in_stack_00000140;
  
  switch(in_RSI) {
  case (int **)0x0:
  case (int **)0x1:
    break;
  case (int **)0x2:
    stable_bitonic_sort_2(in_RDI);
    break;
  case (int **)0x3:
    stable_bitonic_sort_3(in_RDI);
    break;
  case (int **)0x4:
    stable_bitonic_sort_4(in_RDI);
    break;
  case (int **)0x5:
    stable_bitonic_sort_5(in_RDI);
    break;
  case (int **)0x6:
    stable_bitonic_sort_6(in_RDI);
    break;
  case (int **)0x7:
    stable_bitonic_sort_7((int **)0x10c2df);
    break;
  case (int **)0x8:
    stable_bitonic_sort_8(in_RDI);
    break;
  case (int **)0x9:
    stable_bitonic_sort_9(in_stack_00000028);
    break;
  case (int **)0xa:
    stable_bitonic_sort_10(in_stack_00000048);
    break;
  case (int **)0xb:
    stable_bitonic_sort_11(in_stack_00000078);
    break;
  case (int **)0xc:
    stable_bitonic_sort_12(in_stack_00000098);
    break;
  case (int **)0xd:
    stable_bitonic_sort_13(in_stack_000000c8);
    break;
  case (int **)0xe:
    stable_bitonic_sort_14(in_stack_000000f8);
    break;
  case (int **)0xf:
    stable_bitonic_sort_15(in_stack_00000120);
    break;
  case (int **)0x10:
    stable_bitonic_sort_16(in_stack_00000140);
    break;
  default:
    stable_binary_insertion_sort(in_RSI,(size_t)in_RSI);
  }
  return;
}

Assistant:

void BITONIC_SORT(SORT_TYPE *dst, const size_t size) {
  switch (size) {
  case 0:
  case 1:
    break;

  case 2:
    BITONIC_SORT_2(dst);
    break;

  case 3:
    BITONIC_SORT_3(dst);
    break;

  case 4:
    BITONIC_SORT_4(dst);
    break;

  case 5:
    BITONIC_SORT_5(dst);
    break;

  case 6:
    BITONIC_SORT_6(dst);
    break;

  case 7:
    BITONIC_SORT_7(dst);
    break;

  case 8:
    BITONIC_SORT_8(dst);
    break;

  case 9:
    BITONIC_SORT_9(dst);
    break;

  case 10:
    BITONIC_SORT_10(dst);
    break;

  case 11:
    BITONIC_SORT_11(dst);
    break;

  case 12:
    BITONIC_SORT_12(dst);
    break;

  case 13:
    BITONIC_SORT_13(dst);
    break;

  case 14:
    BITONIC_SORT_14(dst);
    break;

  case 15:
    BITONIC_SORT_15(dst);
    break;

  case 16:
    BITONIC_SORT_16(dst);
    break;

  default:
    BINARY_INSERTION_SORT(dst, size);
  }
}